

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

vector<Token,_std::allocator<Token>_> * __thiscall
Tokenizer::getTokens
          (vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,Tokenizer *this,
          TokenizerPosition start,TokenizerPosition end)

{
  _Self __tmp;
  Token tok;
  Token local_80;
  
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; start.it._M_node != end.it._M_node;
      start.it._M_node = (iterator)((_List_node_base *)start.it._M_node)->_M_next) {
    Token::Token(&local_80,(Token *)((long)start.it._M_node + 0x10));
    local_80.checked = false;
    std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_80);
    Token::~Token(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Tokenizer::getTokens(TokenizerPosition start, TokenizerPosition end) const
{
	std::vector<Token> result;

	for (auto it = start.it; it != end.it; it++)
	{
		Token tok = *it;
		tok.checked = false;
		result.push_back(tok);
	}

	return result;
}